

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_trait.cpp
# Opt level: O3

void __thiscall
pfederc::Parser::parseTraitImpl
          (Parser *this,bool *err,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *impltraits)

{
  tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_> tVar1;
  __uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> _Var2;
  __uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_> _Var3;
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var4;
  bool bVar5;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_30;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_28;
  
  parseExpression((Parser *)&stack0xffffffffffffffd0,(Precedence)this);
  if ((_Head_base<0UL,_pfederc::Expr_*,_false>)local_30._M_head_impl !=
      (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
    do {
      _Var3._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
           (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)
           (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_30._M_head_impl;
      if (*(int *)&(((string *)((long)local_30._M_head_impl + 0x18))->_M_dataplus)._M_p != 0x12) {
LAB_0011a016:
        std::
        vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ::_M_insert_rval(impltraits,
                         (impltraits->
                         super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (value_type *)&stack0xffffffffffffffd0);
        if ((Lexer *)local_30._M_head_impl == (Lexer *)0x0) {
          return;
        }
        (*(local_30._M_head_impl)->_vptr_Expr[1])();
        return;
      }
      if ((local_30._M_head_impl)->_vptr_Expr != &PTR__BiOpExpr_0012b990) {
        __cxa_bad_cast();
      }
      if (*(short *)((long)local_30._M_head_impl + 0x40) != 0x2e) goto LAB_0011a016;
      local_28._M_head_impl =
           (((_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_> *)
            ((long)local_30._M_head_impl + 0x50))->super__Head_base<0UL,_pfederc::Expr_*,_false>).
           _M_head_impl;
      *(long *)((long)local_30._M_head_impl + 0x50) = 0;
      if ((tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_28._M_head_impl ==
          (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
        _Var2.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
             (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)local_30._M_head_impl + 0x48))->_M_allocated_capacity;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)((long)local_30._M_head_impl + 0x48))->_M_allocated_capacity = 0;
        _Var4._M_head_impl = local_30._M_head_impl;
        local_30._M_head_impl =
             (Expr *)_Var2.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
LAB_00119fed:
        (**(code **)(*(long *)_Var4._M_head_impl + 8))(_Var4._M_head_impl);
      }
      else {
        std::
        vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ::_M_insert_rval(impltraits,
                         (impltraits->
                         super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (value_type *)&stack0xffffffffffffffd8);
        tVar1.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_> *)
              ((long)_Var3._M_t.
                     super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 0x48);
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)((long)_Var3._M_t.
                   super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                   super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 0x48))->
        _M_allocated_capacity = 0;
        bVar5 = (_Head_base<0UL,_pfederc::Expr_*,_false>)local_30._M_head_impl !=
                (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0;
        _Var4._M_head_impl = local_30._M_head_impl;
        local_30._M_head_impl =
             (Expr *)tVar1.
                     super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
        if (bVar5) goto LAB_00119fed;
      }
      if (local_28._M_head_impl != (Expr *)0x0) {
        (**(code **)((long)*(__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
                             *)local_28._M_head_impl + 8))();
      }
    } while ((_Head_base<0UL,_pfederc::Expr_*,_false>)local_30._M_head_impl !=
             (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0);
  }
  return;
}

Assistant:

void Parser::parseTraitImpl(bool &err,
    std::vector<std::unique_ptr<Expr>> &impltraits) noexcept {
  // inherit traits
  std::unique_ptr<Expr> expr(parseExpression());
  // comma separated list of expressions
  while (expr && isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    auto rhs = biopexpr.getRightPtr();
    if (rhs)
      impltraits.insert(impltraits.begin(), std::move(rhs));
    // next iterator step
    expr = biopexpr.getLeftPtr();
  }

  if (expr)
    impltraits.insert(impltraits.begin(), std::move(expr));
}